

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_options<wchar_t>::basic_json_options(basic_json_options<wchar_t> *this)

{
  basic_json_options_common<wchar_t>::basic_json_options_common
            ((basic_json_options_common<wchar_t> *)
             &(this->super_basic_json_decode_options<wchar_t>).field_0x70);
  (this->super_basic_json_decode_options<wchar_t>)._vptr_basic_json_decode_options =
       (_func_int **)0xb38fb8;
  *(undefined8 *)&(this->super_basic_json_decode_options<wchar_t>).field_0x70 = 0xb38fe0;
  (this->super_basic_json_decode_options<wchar_t>).lossless_number_ = false;
  (this->super_basic_json_decode_options<wchar_t>).allow_comments_ = true;
  (this->super_basic_json_decode_options<wchar_t>).allow_trailing_comma_ = false;
  *(undefined8 *)
   &(this->super_basic_json_decode_options<wchar_t>).err_handler_.super__Function_base._M_functor =
       0;
  *(undefined8 *)
   ((long)&(this->super_basic_json_decode_options<wchar_t>).err_handler_.super__Function_base.
           _M_functor + 8) = 0;
  (this->super_basic_json_decode_options<wchar_t>).err_handler_._M_invoker =
       std::
       _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
       ::_M_invoke;
  (this->super_basic_json_decode_options<wchar_t>).err_handler_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&),_jsoncons::default_json_parsing>
       ::_M_manager;
  basic_json_encode_options<wchar_t>::basic_json_encode_options
            ((basic_json_encode_options<wchar_t> *)
             &(this->super_basic_json_decode_options<wchar_t>).field_0x30,
             &PTR_construction_vtable_24__00b38f80);
  (this->super_basic_json_decode_options<wchar_t>)._vptr_basic_json_decode_options =
       (_func_int **)0xb38f08;
  *(undefined8 *)&(this->super_basic_json_decode_options<wchar_t>).field_0x70 = 0xb38f58;
  *(undefined8 *)&(this->super_basic_json_decode_options<wchar_t>).field_0x30 = 0xb38f30;
  return;
}

Assistant:

basic_json_options() = default;